

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testFutureProofing.cpp
# Opt level: O0

void testFutureProofing(string *tempDir)

{
  int iVar1;
  ostream *poVar2;
  exception *e;
  int numThreads;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffd4;
  string local_28 [40];
  
  std::operator+(in_stack_ffffffffffffffa8,
                 (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  std::__cxx11::string::operator=((string *)(anonymous_namespace)::filename_abi_cxx11_,local_28);
  std::__cxx11::string::~string(local_28);
  poVar2 = std::operator<<((ostream *)&std::cout,"Testing reading future-files");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  random_reseed(0);
  IlmThread_3_2::ThreadPool::globalThreadPool();
  IlmThread_3_2::ThreadPool::numThreads();
  iVar1 = IlmThread_3_2::ThreadPool::globalThreadPool();
  IlmThread_3_2::ThreadPool::setNumThreads(iVar1);
  anon_unknown.dwarf_ffb3f::testWriteRead(in_stack_ffffffffffffffd4);
  anon_unknown.dwarf_ffb3f::testWriteRead(in_stack_ffffffffffffffd4);
  iVar1 = IlmThread_3_2::ThreadPool::globalThreadPool();
  IlmThread_3_2::ThreadPool::setNumThreads(iVar1);
  poVar2 = std::operator<<((ostream *)&std::cout,"ok\n");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void
testFutureProofing (const std::string& tempDir)
{
    filename = tempDir + "imf_test_future_proofing.exr";

    try
    {
        cout << "Testing reading future-files" << endl;

        random_reseed (1);

        int numThreads = ThreadPool::globalThreadPool ().numThreads ();
        ThreadPool::globalThreadPool ().setNumThreads (4);

        testWriteRead (1);
        testWriteRead (10);

        ThreadPool::globalThreadPool ().setNumThreads (numThreads);

        cout << "ok\n" << endl;
    }
    catch (const std::exception& e)
    {
        cerr << "ERROR -- caught exception: " << e.what () << endl;
        assert (false);
    }
}